

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

string * google::protobuf::StrCat_abi_cxx11_(AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d)

{
  AlphaNum *x2;
  AlphaNum *in_RCX;
  AlphaNum *in_RDX;
  AlphaNum *in_RSI;
  AlphaNum *in_RDI;
  AlphaNum *in_R8;
  char *out;
  char *begin;
  string *result;
  AlphaNum *x3;
  AlphaNum *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  reference local_48;
  undefined1 local_29;
  AlphaNum *local_28;
  AlphaNum *local_20;
  AlphaNum *local_18;
  AlphaNum *local_10;
  
  local_29 = 0;
  x3 = in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  x2 = (AlphaNum *)strings::AlphaNum::size(local_10);
  strings::AlphaNum::size(local_18);
  strings::AlphaNum::size(local_20);
  strings::AlphaNum::size(local_28);
  std::__cxx11::string::resize((ulong)in_RDI);
  local_50._M_current = (char *)std::__cxx11::string::begin();
  local_48 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_50);
  Append4(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,x2,x3,in_RDI);
  return (string *)x3;
}

Assistant:

string StrCat(const AlphaNum &a, const AlphaNum &b, const AlphaNum &c,
              const AlphaNum &d) {
  string result;
  result.resize(a.size() + b.size() + c.size() + d.size());
  char *const begin = &*result.begin();
  char *out = Append4(begin, a, b, c, d);
  GOOGLE_DCHECK_EQ(out, begin + result.size());
  return result;
}